

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum.c
# Opt level: O3

void bn_mont_reduction_u64(uint32_t len,uint64_t *n,uint64_t nInv,uint64_t *c,uint64_t *res)

{
  ulong *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  size_t __n;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  undefined4 in_register_0000003c;
  ulong uVar22;
  uint64_t *puVar23;
  ulong uVar24;
  long lVar25;
  void *__s;
  ulong uVar26;
  uint64_t *puVar27;
  bool bVar28;
  long alStack_80 [3];
  uint64_t *local_68;
  ulong local_60;
  ulong local_58;
  size_t local_50;
  uint64_t *local_48;
  ulong local_40;
  ulong local_38;
  
  local_40 = CONCAT44(in_register_0000003c,len);
  if (len == 0) {
    uVar19 = 0;
    uVar26 = 0;
    local_38 = 0;
  }
  else {
    uVar19 = (ulong)(len >> 2);
    uVar26 = (ulong)len;
    local_68 = c + uVar26;
    local_60 = (ulong)(len & 0xfffffffc);
    puVar23 = c + 3;
    uVar24 = 0;
    bVar28 = false;
    puVar27 = c;
    do {
      uVar21 = c[uVar24] * nInv;
      if (len < 4) {
        uVar20 = 0;
      }
      else {
        lVar25 = 0;
        uVar20 = 0;
        do {
          auVar12._8_8_ = 0;
          auVar12._0_8_ = uVar20;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar21;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = *(ulong *)((long)n + lVar25);
          auVar12 = auVar2 * auVar7 + auVar12;
          uVar22 = auVar12._0_8_;
          puVar1 = (ulong *)((long)puVar23 + lVar25 + -0x18);
          uVar20 = *puVar1;
          *puVar1 = *puVar1 + uVar22;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = auVar12._8_8_ + (ulong)CARRY8(uVar20,uVar22);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar21;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = *(ulong *)((long)n + lVar25 + 8);
          auVar13 = auVar3 * auVar8 + auVar13;
          uVar22 = auVar13._0_8_;
          puVar1 = (ulong *)((long)puVar23 + lVar25 + -0x10);
          uVar20 = *puVar1;
          *puVar1 = *puVar1 + uVar22;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = auVar13._8_8_ + (ulong)CARRY8(uVar20,uVar22);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar21;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *(ulong *)((long)n + lVar25 + 0x10);
          auVar14 = auVar4 * auVar9 + auVar14;
          uVar22 = auVar14._0_8_;
          puVar1 = (ulong *)((long)puVar23 + lVar25 + -8);
          uVar20 = *puVar1;
          *puVar1 = *puVar1 + uVar22;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = auVar14._8_8_ + (ulong)CARRY8(uVar20,uVar22);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar21;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = *(ulong *)((long)n + lVar25 + 0x18);
          auVar15 = auVar5 * auVar10 + auVar15;
          uVar22 = auVar15._0_8_;
          puVar1 = (ulong *)((long)puVar23 + lVar25);
          uVar20 = *puVar1;
          *puVar1 = *puVar1 + uVar22;
          uVar20 = auVar15._8_8_ + (ulong)CARRY8(uVar20,uVar22);
          lVar25 = lVar25 + 0x20;
        } while (uVar19 << 5 != lVar25);
      }
      uVar22 = local_60;
      if ((len & 3) != 0) {
        do {
          auVar16._8_8_ = 0;
          auVar16._0_8_ = uVar20;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = uVar21;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = n[uVar22];
          auVar16 = auVar6 * auVar11 + auVar16;
          uVar17 = auVar16._0_8_;
          puVar1 = puVar27 + uVar22;
          uVar20 = *puVar1;
          *puVar1 = *puVar1 + uVar17;
          uVar20 = auVar16._8_8_ + (ulong)CARRY8(uVar20,uVar17);
          uVar22 = uVar22 + 1;
        } while (uVar22 < uVar26);
      }
      uVar21 = (ulong)bVar28;
      uVar22 = uVar20 + c[(int)uVar24 + len];
      bVar28 = CARRY8(uVar20,c[(int)uVar24 + len]) || CARRY8(uVar22,uVar21);
      local_68[uVar24] = uVar22 + uVar21;
      uVar24 = uVar24 + 1;
      puVar23 = puVar23 + 1;
      puVar27 = puVar27 + 1;
    } while (uVar24 != uVar26);
    local_38 = (ulong)bVar28;
    local_58 = uVar19;
  }
  local_50 = uVar26 * 8;
  alStack_80[2] = 0x133169;
  local_48 = res;
  memcpy(res,c + uVar26,local_50);
  __n = local_50;
  lVar25 = -(uVar26 * 8 + 0xf & 0xfffffffffffffff0);
  __s = (void *)((long)&local_68 + lVar25);
  uVar24 = 0;
  *(undefined8 *)((long)alStack_80 + lVar25 + 0x10) = 0x13318e;
  memset(__s,0,__n);
  if (3 < (uint)local_40) {
    lVar18 = 0x18;
    bVar28 = false;
    do {
      uVar24 = *(ulong *)((long)local_48 + lVar18 + -0x18);
      puVar1 = (ulong *)((long)n + lVar18 + -0x18);
      uVar21 = *puVar1;
      uVar22 = uVar24 - *puVar1;
      *(ulong *)((long)alStack_80 + lVar18 + lVar25) = uVar22 - bVar28;
      uVar20 = *(ulong *)((long)local_48 + lVar18 + -0x10);
      puVar1 = (ulong *)((long)n + lVar18 + -0x10);
      uVar22 = (ulong)(uVar24 < uVar21 || uVar22 < bVar28);
      uVar24 = *puVar1;
      uVar17 = uVar20 - *puVar1;
      *(ulong *)((long)alStack_80 + lVar18 + lVar25 + 8) = uVar17 - uVar22;
      uVar21 = *(ulong *)((long)local_48 + lVar18 + -8);
      puVar1 = (ulong *)((long)n + lVar18 + -8);
      uVar20 = (ulong)(uVar20 < uVar24 || uVar17 < uVar22);
      uVar24 = *puVar1;
      uVar22 = uVar21 - *puVar1;
      *(ulong *)((long)alStack_80 + lVar18 + lVar25 + 0x10) = uVar22 - uVar20;
      uVar24 = (ulong)(uVar21 < uVar24 || uVar22 < uVar20);
      uVar21 = *(ulong *)((long)local_48 + lVar18) - *(ulong *)((long)n + lVar18);
      bVar28 = *(ulong *)((long)local_48 + lVar18) < *(ulong *)((long)n + lVar18) || uVar21 < uVar24
      ;
      *(ulong *)((long)__s + lVar18) = uVar21 - uVar24;
      lVar18 = lVar18 + 0x20;
      uVar19 = uVar19 - 1;
    } while (uVar19 != 0);
    uVar24 = (ulong)bVar28;
  }
  if ((local_40 & 3) != 0) {
    uVar19 = (ulong)((uint)uVar26 & 0xfffffffc);
    do {
      uVar21 = (ulong)((char)uVar24 != '\0');
      uVar20 = local_48[uVar19] - n[uVar19];
      bVar28 = local_48[uVar19] < n[uVar19] || uVar20 < uVar21;
      uVar24 = (ulong)bVar28;
      *(ulong *)((long)__s + uVar19 * 8) = uVar20 - uVar21;
      uVar19 = uVar19 + 1;
    } while (uVar19 < uVar26);
    uVar24 = (ulong)bVar28;
  }
  if ((uint)local_40 != 0) {
    uVar19 = 0;
    do {
      local_48[uVar19] =
           *(ulong *)((long)__s + uVar19 * 8) & ~(local_38 - uVar24) |
           local_48[uVar19] & local_38 - uVar24;
      uVar19 = uVar19 + 1;
    } while (uVar26 != uVar19);
  }
  return;
}

Assistant:

static void
bn_mont_reduction_u64(uint32_t len, uint64_t *n, uint64_t nInv, uint64_t *c, uint64_t *res)
{
  uint64_t c0 = 0ULL;
  for (uint32_t i0 = 0U; i0 < len; i0++)
  {
    uint64_t qj = nInv * c[i0];
    uint64_t *res_j0 = c + i0;
    uint64_t c1 = 0ULL;
    for (uint32_t i = 0U; i < len / 4U; i++)
    {
      uint64_t a_i = n[4U * i];
      uint64_t *res_i0 = res_j0 + 4U * i;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u64(a_i, qj, c1, res_i0);
      uint64_t a_i0 = n[4U * i + 1U];
      uint64_t *res_i1 = res_j0 + 4U * i + 1U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u64(a_i0, qj, c1, res_i1);
      uint64_t a_i1 = n[4U * i + 2U];
      uint64_t *res_i2 = res_j0 + 4U * i + 2U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u64(a_i1, qj, c1, res_i2);
      uint64_t a_i2 = n[4U * i + 3U];
      uint64_t *res_i = res_j0 + 4U * i + 3U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u64(a_i2, qj, c1, res_i);
    }
    for (uint32_t i = len / 4U * 4U; i < len; i++)
    {
      uint64_t a_i = n[i];
      uint64_t *res_i = res_j0 + i;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u64(a_i, qj, c1, res_i);
    }
    uint64_t r = c1;
    uint64_t c10 = r;
    uint64_t *resb = c + len + i0;
    uint64_t res_j = c[len + i0];
    c0 = Lib_IntTypes_Intrinsics_add_carry_u64(c0, c10, res_j, resb);
  }
  memcpy(res, c + len, (len + len - len) * sizeof (uint64_t));
  uint64_t c00 = c0;
  KRML_CHECK_SIZE(sizeof (uint64_t), len);
  uint64_t tmp[len];
  memset(tmp, 0U, len * sizeof (uint64_t));
  uint64_t c1 = 0ULL;
  for (uint32_t i = 0U; i < len / 4U; i++)
  {
    uint64_t t1 = res[4U * i];
    uint64_t t20 = n[4U * i];
    uint64_t *res_i0 = tmp + 4U * i;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u64(c1, t1, t20, res_i0);
    uint64_t t10 = res[4U * i + 1U];
    uint64_t t21 = n[4U * i + 1U];
    uint64_t *res_i1 = tmp + 4U * i + 1U;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u64(c1, t10, t21, res_i1);
    uint64_t t11 = res[4U * i + 2U];
    uint64_t t22 = n[4U * i + 2U];
    uint64_t *res_i2 = tmp + 4U * i + 2U;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u64(c1, t11, t22, res_i2);
    uint64_t t12 = res[4U * i + 3U];
    uint64_t t2 = n[4U * i + 3U];
    uint64_t *res_i = tmp + 4U * i + 3U;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u64(c1, t12, t2, res_i);
  }
  for (uint32_t i = len / 4U * 4U; i < len; i++)
  {
    uint64_t t1 = res[i];
    uint64_t t2 = n[i];
    uint64_t *res_i = tmp + i;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u64(c1, t1, t2, res_i);
  }
  uint64_t c10 = c1;
  uint64_t c2 = c00 - c10;
  for (uint32_t i = 0U; i < len; i++)
  {
    uint64_t *os = res;
    uint64_t x = (c2 & res[i]) | (~c2 & tmp[i]);
    os[i] = x;
  }
}